

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorRegressor::InternalSwap
          (SupportVectorRegressor *this,SupportVectorRegressor *other)

{
  SupportVectorRegressor *other_local;
  SupportVectorRegressor *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::memswap<24>((char *)&this->kernel_,(char *)&other->kernel_);
  std::swap<CoreML::Specification::SupportVectorRegressor::SupportVectorsUnion>
            (&this->supportVectors_,&other->supportVectors_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  return;
}

Assistant:

void SupportVectorRegressor::InternalSwap(SupportVectorRegressor* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(SupportVectorRegressor, rho_)
      + sizeof(SupportVectorRegressor::rho_)
      - PROTOBUF_FIELD_OFFSET(SupportVectorRegressor, kernel_)>(
          reinterpret_cast<char*>(&kernel_),
          reinterpret_cast<char*>(&other->kernel_));
  swap(supportVectors_, other->supportVectors_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}